

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

Function __thiscall
mp::BasicExprFactory<std::allocator<char>_>::CreateFunction
          (BasicExprFactory<std::allocator<char>_> *this,Impl **impl,StringRef name,int num_args,
          Type type)

{
  undefined1 auVar1 [16];
  StringRef src;
  SafeInt<unsigned_long> n;
  unsigned_long uVar2;
  ulong uVar3;
  undefined4 *puVar4;
  undefined8 *in_RSI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  Impl *new_impl;
  SafeInt<unsigned_long> size;
  unsigned_long in_stack_ffffffffffffffa0;
  SafeInt<unsigned_long> in_stack_ffffffffffffffa8;
  SafeInt<unsigned_long> local_38;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 *local_28;
  BasicStringRef<char> local_18;
  Function local_8;
  
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_RSI;
  SafeInt<unsigned_long>::SafeInt(&local_38,0xc);
  fmt::BasicStringRef<char>::size(&local_18);
  n = mp::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  uVar2 = mp::val(n);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  puVar4 = (undefined4 *)operator_new__(uVar3);
  *puVar4 = local_30;
  puVar4[1] = local_2c;
  src.size_ = (size_t)puVar4;
  src.data_ = (char *)n.value_;
  Copy(src,(char *)local_38.value_);
  *local_28 = puVar4;
  Function::Function(&local_8,(Impl *)*local_28);
  return (Function)local_8.impl_;
}

Assistant:

Function BasicExprFactory<Alloc>::CreateFunction(
    const Function::Impl *&impl, fmt::StringRef name,
    int num_args, func::Type type) {
  /// Function::Impl already has space for terminating null char so
  /// we need to allocate extra size chars only.
  typedef Function::Impl Impl;
  SafeInt<std::size_t> size = sizeof(Impl);
  // Replace by ::new due to #174
  Impl* new_impl = (Impl*) new char* [val(size + name.size())];
  new_impl->type = type;
  new_impl->num_args = num_args;
  this->Copy(name, new_impl->name);
  impl = new_impl;
  return Function(impl);
}